

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O2

char * strnstr(char *haystack,char *needle,size_t len)

{
  char *__s1;
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  size_t __n;
  
  pvVar2 = memchr(needle,0,len);
  if ((long)pvVar2 - (long)needle != 0) {
    __n = (long)pvVar2 - (long)needle;
    if (pvVar2 == (void *)0x0) {
      __n = len;
    }
    for (uVar3 = 0; uVar3 <= len - __n; uVar3 = uVar3 + 1) {
      __s1 = haystack + uVar3;
      if ((*__s1 == *needle) && (iVar1 = strncmp(__s1,needle,__n), iVar1 == 0)) {
        return __s1;
      }
    }
    haystack = (char *)0x0;
  }
  return haystack;
}

Assistant:

static char*
strnstr(const char *haystack, const char *needle, size_t len)
{
    size_t i;
    size_t needleLen;
    const char* needleEnd;

    // strnlen is not part of the C standard and does not compile on some platforms, 
    // use case is covered by memchr.
    needleEnd = (char *)memchr(needle, 0, len);
    if (needleEnd == needle)
        return (char *)haystack;

    needleLen = len;
    if (needleEnd != NULL)
        needleLen = needleEnd - needle;

    for (i = 0; i <= len - needleLen; i++)
    {
        if (haystack[0] == needle[0]
            && strncmp(haystack, needle, needleLen) == 0)
            return (char *)haystack;
        haystack++;
    }
    return NULL;
}